

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test1::
verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidLocation(GPUShaderFP64Test1 *this)

{
  GPUShaderFP64Test1 *this_00;
  uint n_uniform_location;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  char *__s;
  size_t sVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  GPUShaderFP64Test1 *this_01;
  _uniform_function func;
  bool bVar8;
  byte bVar9;
  double double_data [16];
  undefined8 local_318 [16];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined1 auStack_1b0 [120];
  ios_base aiStack_138 [264];
  long lVar3;
  
  bVar9 = 0;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_298._0_4_ = this->m_po_bool_arr_uniform_location;
  local_298._4_4_ = this->m_po_bool_uniform_location;
  uStack_290._0_4_ = this->m_po_bvec2_arr_uniform_location;
  uStack_290._4_4_ = this->m_po_bvec2_uniform_location;
  local_288._0_4_ = this->m_po_bvec3_arr_uniform_location;
  local_288._4_4_ = this->m_po_bvec3_uniform_location;
  uStack_280._0_4_ = this->m_po_bvec4_arr_uniform_location;
  uStack_280._4_4_ = this->m_po_bvec4_uniform_location;
  local_278._0_4_ = this->m_po_dmat2_arr_uniform_location;
  local_278._4_4_ = this->m_po_dmat2_uniform_location;
  uStack_270._0_4_ = this->m_po_dmat2x3_arr_uniform_location;
  uStack_270._4_4_ = this->m_po_dmat2x3_uniform_location;
  local_268._0_4_ = this->m_po_dmat2x4_arr_uniform_location;
  local_268._4_4_ = this->m_po_dmat2x4_uniform_location;
  uStack_260._0_4_ = this->m_po_dmat3_arr_uniform_location;
  uStack_260._4_4_ = this->m_po_dmat3_uniform_location;
  local_258._0_4_ = this->m_po_dmat3x2_arr_uniform_location;
  local_258._4_4_ = this->m_po_dmat3x2_uniform_location;
  uStack_250._0_4_ = this->m_po_dmat3x4_arr_uniform_location;
  uStack_250._4_4_ = this->m_po_dmat3x4_uniform_location;
  local_248._0_4_ = this->m_po_dmat4_arr_uniform_location;
  local_248._4_4_ = this->m_po_dmat4_uniform_location;
  uStack_240._0_4_ = this->m_po_dmat4x2_arr_uniform_location;
  uStack_240._4_4_ = this->m_po_dmat4x2_uniform_location;
  local_238._0_4_ = this->m_po_dmat4x3_arr_uniform_location;
  local_238._4_4_ = this->m_po_dmat4x3_uniform_location;
  uStack_230._0_4_ = this->m_po_double_arr_uniform_location;
  uStack_230._4_4_ = this->m_po_double_uniform_location;
  local_228._0_4_ = this->m_po_dvec2_arr_uniform_location;
  local_228._4_4_ = this->m_po_dvec2_uniform_location;
  uStack_220._0_4_ = this->m_po_dvec3_arr_uniform_location;
  uStack_220._4_4_ = this->m_po_dvec3_uniform_location;
  local_218._0_4_ = this->m_po_dvec4_arr_uniform_location;
  local_218._4_4_ = this->m_po_dvec4_uniform_location;
  uStack_210._0_4_ = this->m_po_float_arr_uniform_location;
  uStack_210._4_4_ = this->m_po_float_uniform_location;
  local_208._0_4_ = this->m_po_int_arr_uniform_location;
  local_208._4_4_ = this->m_po_int_uniform_location;
  uStack_200._0_4_ = this->m_po_ivec2_arr_uniform_location;
  uStack_200._4_4_ = this->m_po_ivec2_uniform_location;
  local_1f8._0_4_ = this->m_po_ivec3_arr_uniform_location;
  local_1f8._4_4_ = this->m_po_ivec3_uniform_location;
  uStack_1f0._0_4_ = this->m_po_ivec4_arr_uniform_location;
  uStack_1f0._4_4_ = this->m_po_ivec4_uniform_location;
  local_1e8._0_4_ = this->m_po_uint_arr_uniform_location;
  local_1e8._4_4_ = this->m_po_uint_uniform_location;
  uStack_1e0._0_4_ = this->m_po_uvec2_arr_uniform_location;
  uStack_1e0._4_4_ = this->m_po_uvec2_uniform_location;
  local_1d8._0_4_ = this->m_po_uvec3_arr_uniform_location;
  local_1d8._4_4_ = this->m_po_uvec3_uniform_location;
  uStack_1d0._0_4_ = this->m_po_uvec4_arr_uniform_location;
  uStack_1d0._4_4_ = this->m_po_uvec4_uniform_location;
  local_1c8._0_4_ = this->m_po_vec2_arr_uniform_location;
  local_1c8._4_4_ = this->m_po_vec2_uniform_location;
  uStack_1c0._0_4_ = this->m_po_vec3_arr_uniform_location;
  uStack_1c0._4_4_ = this->m_po_vec3_uniform_location;
  local_1b8._0_4_ = this->m_po_vec4_arr_uniform_location;
  local_1b8._4_4_ = this->m_po_vec4_uniform_location;
  iVar1 = -1;
  lVar4 = 0;
  do {
    iVar2 = *(int *)((long)&local_298 + lVar4 * 4);
    if (iVar1 < iVar2) {
      iVar1 = iVar2;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x3a);
  puVar6 = &DAT_01a44b10;
  puVar7 = local_318;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar7 = *puVar6;
    puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
  }
  this_00 = (GPUShaderFP64Test1 *)(auStack_1b0 + 8);
  func = UNIFORM_FUNCTION_1D;
  bVar8 = true;
  (**(code **)(lVar3 + 0x14d0))(0,iVar1 + 1);
  while( true ) {
    iVar2 = (**(code **)(lVar3 + 0x800))();
    if (iVar2 != 0x502) {
      auStack_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      this_01 = this_00;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Function ",9);
      __s = getUniformFunctionString(this_01,func);
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 "() did not generate an error when passed an invalid uniform location different from -1."
                 ,0x57);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)auStack_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      std::ios_base::~ios_base(aiStack_138);
      bVar8 = false;
    }
    func = func + UNIFORM_FUNCTION_1DV;
    if (func == UNIFORM_FUNCTION_COUNT) break;
    (**(code **)(lVar3 + 0x14d8))(iVar1 + 1,1,local_318);
  }
  return bVar8;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidLocation()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Find the largest valid uniform location */
	const glw::GLint uniform_locations[] = {
		m_po_bool_arr_uniform_location,	m_po_bool_uniform_location,		  m_po_bvec2_arr_uniform_location,
		m_po_bvec2_uniform_location,	   m_po_bvec3_arr_uniform_location,   m_po_bvec3_uniform_location,
		m_po_bvec4_arr_uniform_location,   m_po_bvec4_uniform_location,		  m_po_dmat2_arr_uniform_location,
		m_po_dmat2_uniform_location,	   m_po_dmat2x3_arr_uniform_location, m_po_dmat2x3_uniform_location,
		m_po_dmat2x4_arr_uniform_location, m_po_dmat2x4_uniform_location,	 m_po_dmat3_arr_uniform_location,
		m_po_dmat3_uniform_location,	   m_po_dmat3x2_arr_uniform_location, m_po_dmat3x2_uniform_location,
		m_po_dmat3x4_arr_uniform_location, m_po_dmat3x4_uniform_location,	 m_po_dmat4_arr_uniform_location,
		m_po_dmat4_uniform_location,	   m_po_dmat4x2_arr_uniform_location, m_po_dmat4x2_uniform_location,
		m_po_dmat4x3_arr_uniform_location, m_po_dmat4x3_uniform_location,	 m_po_double_arr_uniform_location,
		m_po_double_uniform_location,	  m_po_dvec2_arr_uniform_location,   m_po_dvec2_uniform_location,
		m_po_dvec3_arr_uniform_location,   m_po_dvec3_uniform_location,		  m_po_dvec4_arr_uniform_location,
		m_po_dvec4_uniform_location,	   m_po_float_arr_uniform_location,   m_po_float_uniform_location,
		m_po_int_arr_uniform_location,	 m_po_int_uniform_location,		  m_po_ivec2_arr_uniform_location,
		m_po_ivec2_uniform_location,	   m_po_ivec3_arr_uniform_location,   m_po_ivec3_uniform_location,
		m_po_ivec4_arr_uniform_location,   m_po_ivec4_uniform_location,		  m_po_uint_arr_uniform_location,
		m_po_uint_uniform_location,		   m_po_uvec2_arr_uniform_location,   m_po_uvec2_uniform_location,
		m_po_uvec3_arr_uniform_location,   m_po_uvec3_uniform_location,		  m_po_uvec4_arr_uniform_location,
		m_po_uvec4_uniform_location,	   m_po_vec2_arr_uniform_location,	m_po_vec2_uniform_location,
		m_po_vec3_arr_uniform_location,	m_po_vec3_uniform_location,		  m_po_vec4_arr_uniform_location,
		m_po_vec4_uniform_location
	};
	const unsigned int n_uniform_locations	= sizeof(uniform_locations) / sizeof(uniform_locations[0]);
	glw::GLint		   valid_uniform_location = -1;

	for (unsigned int n_uniform_location = 0; n_uniform_location < n_uniform_locations; ++n_uniform_location)
	{
		glw::GLint uniform_location = uniform_locations[n_uniform_location];

		if (uniform_location > valid_uniform_location)
		{
			valid_uniform_location = uniform_location;
		}
	} /* for (all  uniform locations) */

	/* Iterate through all uniform functions and make sure GL_INVALID_OPERATION error is always generated
	 * for invalid uniform location that is != -1
	 */
	const double double_data[] = {
		1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0, 8.0, 9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0, 16.0
	};
	const glw::GLint invalid_uniform_location = valid_uniform_location + 1;

	for (unsigned int n_uniform_function = UNIFORM_FUNCTION_FIRST; n_uniform_function < UNIFORM_FUNCTION_COUNT;
		 ++n_uniform_function)
	{
		_uniform_function uniform_function = (_uniform_function)n_uniform_function;

		switch (uniform_function)
		{
		case UNIFORM_FUNCTION_1D:
			gl.uniform1d(invalid_uniform_location, 0.0);
			break;
		case UNIFORM_FUNCTION_2D:
			gl.uniform2d(invalid_uniform_location, 0.0, 1.0);
			break;
		case UNIFORM_FUNCTION_3D:
			gl.uniform3d(invalid_uniform_location, 0.0, 1.0, 2.0);
			break;
		case UNIFORM_FUNCTION_4D:
			gl.uniform4d(invalid_uniform_location, 0.0, 1.0, 2.0, 3.0);
			break;

		case UNIFORM_FUNCTION_1DV:
			gl.uniform1dv(invalid_uniform_location, 1 /* count */, double_data);
			break;
		case UNIFORM_FUNCTION_2DV:
			gl.uniform2dv(invalid_uniform_location, 1 /* count */, double_data);
			break;
		case UNIFORM_FUNCTION_3DV:
			gl.uniform3dv(invalid_uniform_location, 1 /* count */, double_data);
			break;
		case UNIFORM_FUNCTION_4DV:
			gl.uniform4dv(invalid_uniform_location, 1 /* count */, double_data);
			break;

		case UNIFORM_FUNCTION_MATRIX2DV:
			gl.uniformMatrix2dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX2X3DV:
			gl.uniformMatrix2x3dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX2X4DV:
			gl.uniformMatrix2x4dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX3DV:
			gl.uniformMatrix3dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX3X2DV:
			gl.uniformMatrix3x2dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX3X4DV:
			gl.uniformMatrix3x4dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX4DV:
			gl.uniformMatrix4dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX4X2DV:
			gl.uniformMatrix4x2dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;
		case UNIFORM_FUNCTION_MATRIX4X3DV:
			gl.uniformMatrix4x3dv(invalid_uniform_location, 1 /* count */, GL_FALSE /* transpose */, double_data);
			break;

		default:
		{
			TCU_FAIL("Unrecognized uniform function");
		}
		}

		const glw::GLenum error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Function " << getUniformFunctionString(uniform_function)
							   << "() did not generate an error"
								  " when passed an invalid uniform location different from -1."
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all uniform functions) */

	return result;
}